

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetConfRPLIDAR(RPLIDAR *pRPLIDAR,int type,uchar *payload,int payloadsize,uchar *resppayload,
                  int resppayloadsize)

{
  uchar *readbuf;
  uchar uVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  int DataType;
  int DataResponseLength;
  int SendMode;
  uchar *local_c0;
  uchar reqbuf [136];
  
  DataResponseLength = 0;
  SendMode = 0;
  DataType = 0;
  if ((uint)payloadsize < 0x81) {
    local_c0 = resppayload;
    memset(reqbuf,0,0x88);
    reqbuf[0] = 0xa5;
    reqbuf[1] = 0x84;
    reqbuf[2] = (char)payloadsize + '\x04';
    reqbuf._3_4_ = type;
    if (payloadsize != 0) {
      memcpy(reqbuf + 7,payload,(ulong)(uint)payloadsize);
    }
    uVar1 = ComputeChecksumRPLIDAR(reqbuf,payloadsize + 8);
    reqbuf[(ulong)(uint)payloadsize + 7] = uVar1;
    iVar2 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,payloadsize + 8);
    if (iVar2 == 0) {
      iVar3 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataResponseLength,&SendMode,&DataType);
      readbuf = local_c0;
      iVar2 = DataResponseLength;
      if (iVar3 == 0) {
        if (DataType == 0x20) {
          if (resppayloadsize < DataResponseLength) {
            pcVar4 = "Error writing data to a RPLIDAR : Invalid resppayloadsize. ";
          }
          else {
            memset(local_c0,0,(long)DataResponseLength);
            iVar2 = ReadAllRS232Port(&pRPLIDAR->RS232Port,readbuf,iVar2);
            if (iVar2 == 0) {
              return 0;
            }
            pcVar4 = "A RPLIDAR is not responding correctly. ";
          }
        }
        else {
          pcVar4 = "A RPLIDAR is not responding correctly : Bad response descriptor. ";
        }
        puts(pcVar4);
      }
      return 1;
    }
    pcVar4 = "Error writing data to a RPLIDAR. ";
  }
  else {
    pcVar4 = "Error writing data to a RPLIDAR : Invalid payloadsize. ";
  }
  puts(pcVar4);
  return 1;
}

Assistant:

inline int GetConfRPLIDAR(RPLIDAR* pRPLIDAR, int type, unsigned char* payload, int payloadsize, unsigned char* resppayload, int resppayloadsize)
{
	unsigned char reqbuf[136];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	if ((payloadsize < 0)||(payloadsize > 128))
	{
		printf("Error writing data to a RPLIDAR : Invalid payloadsize. \n");
		return EXIT_FAILURE;
	}

	memset(reqbuf, 0, sizeof(reqbuf));
	reqbuf[0] = START_FLAG1_RPLIDAR;
	reqbuf[1] = GET_LIDAR_CONF_REQUEST_RPLIDAR;
	reqbuf[2] = (unsigned char)(4+payloadsize);
	memcpy(reqbuf+3, (unsigned char*)&type, 4);
	if (payloadsize > 0) memcpy(reqbuf+7, payload, payloadsize);
	reqbuf[7+payloadsize] = ComputeChecksumRPLIDAR(reqbuf, 8+payloadsize);

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, 8+payloadsize) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if (DataType != GET_LIDAR_CONF_RESPONSE_RPLIDAR)
	{
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;
	}

	if (DataResponseLength > resppayloadsize)
	{
		printf("Error writing data to a RPLIDAR : Invalid resppayloadsize. \n");
		return EXIT_FAILURE;
	}

	// Receive the data response.
	memset(resppayload, 0, DataResponseLength);
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, resppayload, DataResponseLength) != EXIT_SUCCESS)
	{
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;
	}
	return EXIT_SUCCESS;
}